

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O1

void __thiscall duckdb::SelectionVector::Initialize(SelectionVector *this,idx_t count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SelectionData *pSVar1;
  SelectionData *__tmp;
  undefined1 local_39;
  SelectionData *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  idx_t local_28;
  
  local_38 = (element_type *)0x0;
  local_28 = count;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::SelectionData,std::allocator<duckdb::SelectionData>,unsigned_long&>
            (&local_30,&local_38,(allocator<duckdb::SelectionData> *)&local_39,&local_28);
  pSVar1 = local_38;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  (this->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pSVar1;
  this_00 = (this->selection_data).internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_30._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pSVar1 = shared_ptr<duckdb::SelectionData,_true>::operator->(&this->selection_data);
  this->sel_vector = *(sel_t **)(pSVar1 + 8);
  return;
}

Assistant:

void Initialize(idx_t count = STANDARD_VECTOR_SIZE) {
		selection_data = make_shared_ptr<SelectionData>(count);
		sel_vector = reinterpret_cast<sel_t *>(selection_data->owned_data.get());
	}